

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O2

bool __thiscall cmListFile::ParseFile(cmListFile *this,char *filename,bool topLevel,cmMakefile *mf)

{
  cmMakefile **ppcVar1;
  bool bVar2;
  undefined4 uVar3;
  undefined7 extraout_var;
  iterator iVar4;
  pointer pcVar5;
  long lVar6;
  string name;
  allocator local_e5;
  undefined4 local_e4;
  allocator local_e0 [32];
  cmMakefile *local_c0;
  cmListFileParser parser;
  
  bVar2 = cmsys::SystemTools::FileExists(filename);
  if (bVar2) {
    std::__cxx11::string::string((string *)&parser,filename,(allocator *)&name);
    bVar2 = cmsys::SystemTools::FileIsDirectory((string *)&parser);
    std::__cxx11::string::~string((string *)&parser);
    if (!bVar2) {
      parser.ListFile = this;
      parser.Makefile = mf;
      parser.FileName = filename;
      parser.Lexer = cmListFileLexer_New();
      parser.Function.super_cmListFileContext.Name._M_string_length = 0;
      parser.Function.super_cmListFileContext.Name.field_2._M_local_buf[0] = '\0';
      parser.Function.super_cmListFileContext.FilePath._M_dataplus._M_p =
           (pointer)&parser.Function.super_cmListFileContext.FilePath.field_2;
      parser.Function.super_cmListFileContext.FilePath._M_string_length = 0;
      parser.Function.super_cmListFileContext.FilePath.field_2._M_allocated_capacity =
           parser.Function.super_cmListFileContext.FilePath.field_2._M_allocated_capacity &
           0xffffffffffffff00;
      parser.Function.super_cmListFileContext.Line = 0;
      parser.Function.Arguments.
      super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      parser.Function.Arguments.
      super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      parser.Function.Arguments.
      super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      parser.Function.super_cmListFileContext.Name._M_dataplus._M_p =
           (pointer)&parser.Function.super_cmListFileContext.Name.field_2;
      bVar2 = cmListFileParser::ParseFile(&parser);
      uVar3 = (undefined4)CONCAT71(extraout_var,bVar2);
      cmListFileParser::~cmListFileParser(&parser);
      local_e4 = uVar3;
      if (!topLevel) goto LAB_0042615e;
      pcVar5 = (this->Functions).
               super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar6 = -(long)pcVar5;
      local_c0 = mf;
      do {
        if (pcVar5 == (this->Functions).
                      super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                      _M_impl.super__Vector_impl_data._M_finish) {
          if (0x1d < (ulong)(-((long)&(((this->Functions).
                                        super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      super_cmListFileContext).Name + lVar6) / 0x60))
          goto LAB_0042646a;
          ppcVar1 = &parser.Makefile;
          parser.Makefile = (cmMakefile *)((ulong)parser.Makefile & 0xffffffff00000000);
          parser.FileName = (char *)0x0;
          parser.Function.super_cmListFileContext.Name._M_string_length = 0;
          parser.Lexer = (cmListFileLexer *)ppcVar1;
          parser.Function.super_cmListFileContext.Name._M_dataplus._M_p = (pointer)ppcVar1;
          std::__cxx11::string::string((string *)&name,"project",local_e0);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&parser,&name);
          std::__cxx11::string::~string((string *)&name);
          std::__cxx11::string::string((string *)&name,"set",local_e0);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&parser,&name);
          std::__cxx11::string::~string((string *)&name);
          std::__cxx11::string::string((string *)&name,"if",local_e0);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&parser,&name);
          std::__cxx11::string::~string((string *)&name);
          std::__cxx11::string::string((string *)&name,"endif",local_e0);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&parser,&name);
          std::__cxx11::string::~string((string *)&name);
          std::__cxx11::string::string((string *)&name,"else",local_e0);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&parser,&name);
          std::__cxx11::string::~string((string *)&name);
          std::__cxx11::string::string((string *)&name,"elseif",local_e0);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&parser,&name);
          std::__cxx11::string::~string((string *)&name);
          std::__cxx11::string::string((string *)&name,"add_executable",local_e0);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&parser,&name);
          std::__cxx11::string::~string((string *)&name);
          std::__cxx11::string::string((string *)&name,"add_library",local_e0);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&parser,&name);
          std::__cxx11::string::~string((string *)&name);
          std::__cxx11::string::string((string *)&name,"target_link_libraries",local_e0);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&parser,&name);
          std::__cxx11::string::~string((string *)&name);
          std::__cxx11::string::string((string *)&name,"option",local_e0);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&parser,&name);
          std::__cxx11::string::~string((string *)&name);
          std::__cxx11::string::string((string *)&name,"message",local_e0);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&parser,&name);
          std::__cxx11::string::~string((string *)&name);
          pcVar5 = (this->Functions).
                   super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          goto LAB_00426430;
        }
        cmsys::SystemTools::LowerCase((string *)&parser,(string *)pcVar5);
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&parser,"cmake_minimum_required");
        std::__cxx11::string::~string((string *)&parser);
        pcVar5 = pcVar5 + 1;
        lVar6 = lVar6 + -0x60;
      } while (!bVar2);
      goto LAB_0042648e;
    }
  }
  local_e4 = 0;
  goto LAB_0042615e;
  while( true ) {
    cmsys::SystemTools::LowerCase(&name,(string *)pcVar5);
    iVar4 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&parser,&name);
    std::__cxx11::string::~string((string *)&name);
    pcVar5 = pcVar5 + 1;
    if (iVar4._M_node == (_Base_ptr)ppcVar1) break;
LAB_00426430:
    if (pcVar5 == (this->Functions).
                  super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&parser);
      goto LAB_0042648e;
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&parser);
LAB_0042646a:
  local_c0->CheckCMP0000 = true;
  cmMakefile::SetPolicyVersion(local_c0,"2.4");
LAB_0042648e:
  pcVar5 = (this->Functions).
           super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
           super__Vector_impl_data._M_start;
  do {
    if (pcVar5 == (this->Functions).
                  super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
      parser.ListFile = (cmListFile *)&parser.FileName;
      parser.Makefile = (cmMakefile *)0x0;
      parser.FileName = (char *)((ulong)parser.FileName & 0xffffffffffffff00);
      parser.Function.super_cmListFileContext.Name._M_dataplus._M_p =
           (pointer)&parser.Function.super_cmListFileContext.Name.field_2;
      parser.Function.super_cmListFileContext.Name._M_string_length = 0;
      parser.Function.super_cmListFileContext.Name.field_2._M_local_buf[0] = '\0';
      parser.Function.super_cmListFileContext.FilePath._M_dataplus._M_p = (pointer)0x0;
      parser.Function.super_cmListFileContext.FilePath._M_string_length = 0;
      parser.Function.super_cmListFileContext.FilePath.field_2._M_allocated_capacity = 0;
      parser.Function.super_cmListFileContext.FilePath.field_2._8_8_ = 0;
      std::__cxx11::string::assign((char *)&parser);
      std::__cxx11::string::string((string *)local_e0,"Project",&local_e5);
      std::__cxx11::string::string((string *)&name,(string *)local_e0);
      std::__cxx11::string::~string((string *)local_e0);
      std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::push_back
                ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)
                 &parser.Function.super_cmListFileContext.FilePath._M_string_length,
                 (value_type *)&name);
      std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::insert
                (&this->Functions,
                 (this->Functions).
                 super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl
                 .super__Vector_impl_data._M_start,(value_type *)&parser);
      uVar3 = local_e4;
      std::__cxx11::string::~string((string *)&name);
      cmListFileFunction::~cmListFileFunction((cmListFileFunction *)&parser);
      local_e4 = uVar3;
      break;
    }
    cmsys::SystemTools::LowerCase((string *)&parser,(string *)pcVar5);
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &parser,"project");
    std::__cxx11::string::~string((string *)&parser);
    pcVar5 = pcVar5 + 1;
  } while (!bVar2);
LAB_0042615e:
  return SUB41(local_e4,0);
}

Assistant:

bool cmListFile::ParseFile(const char* filename,
                           bool topLevel,
                           cmMakefile *mf)
{
  if(!cmSystemTools::FileExists(filename) ||
     cmSystemTools::FileIsDirectory(filename))
    {
    return false;
    }

  bool parseError = false;

  {
  cmListFileParser parser(this, mf, filename);
  parseError = !parser.ParseFile();
  }

  // do we need a cmake_policy(VERSION call?
  if(topLevel)
  {
    bool hasVersion = false;
    // search for the right policy command
    for(std::vector<cmListFileFunction>::iterator i
          = this->Functions.begin();
        i != this->Functions.end(); ++i)
    {
      if (cmSystemTools::LowerCase(i->Name) == "cmake_minimum_required")
      {
        hasVersion = true;
        break;
      }
    }
    // if no policy command is found this is an error if they use any
    // non advanced functions or a lot of functions
    if(!hasVersion)
    {
      bool isProblem = true;
      if (this->Functions.size() < 30)
      {
        // the list of simple commands DO NOT ADD TO THIS LIST!!!!!
        // these commands must have backwards compatibility forever and
        // and that is a lot longer than your tiny mind can comprehend mortal
        std::set<std::string> allowedCommands;
        allowedCommands.insert("project");
        allowedCommands.insert("set");
        allowedCommands.insert("if");
        allowedCommands.insert("endif");
        allowedCommands.insert("else");
        allowedCommands.insert("elseif");
        allowedCommands.insert("add_executable");
        allowedCommands.insert("add_library");
        allowedCommands.insert("target_link_libraries");
        allowedCommands.insert("option");
        allowedCommands.insert("message");
        isProblem = false;
        for(std::vector<cmListFileFunction>::iterator i
              = this->Functions.begin();
            i != this->Functions.end(); ++i)
        {
          std::string name = cmSystemTools::LowerCase(i->Name);
          if (allowedCommands.find(name) == allowedCommands.end())
          {
            isProblem = true;
            break;
          }
        }
      }

      if (isProblem)
      {
      // Tell the top level cmMakefile to diagnose
      // this violation of CMP0000.
      mf->SetCheckCMP0000(true);

      // Implicitly set the version for the user.
      mf->SetPolicyVersion("2.4");
      }
    }
  }

  if(topLevel)
    {
    bool hasProject = false;
    // search for a project command
    for(std::vector<cmListFileFunction>::iterator i
          = this->Functions.begin();
        i != this->Functions.end(); ++i)
      {
      if(cmSystemTools::LowerCase(i->Name) == "project")
        {
        hasProject = true;
        break;
        }
      }
    // if no project command is found, add one
    if(!hasProject)
      {
      cmListFileFunction project;
      project.Name = "PROJECT";
      cmListFileArgument prj("Project", cmListFileArgument::Unquoted, 0);
      project.Arguments.push_back(prj);
      this->Functions.insert(this->Functions.begin(),project);
      }
    }
  if(parseError)
    {
    return false;
    }
  return true;
}